

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::ArrayElementEnumerator::Init(ArrayElementEnumerator *this,JavascriptArray *arr)

{
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  uint uVar3;
  SparseArraySegmentBase *pSVar4;
  bool bVar5;
  
  if (arr == (JavascriptArray *)0x0) {
    pSVar2 = (SparseArraySegmentBase *)0x0;
  }
  else {
    pSVar2 = GetBeginLookupSegment(arr,this->start,true);
  }
  this->seg = pSVar2;
  bVar5 = pSVar2 == (SparseArraySegmentBase *)0x0;
  if (!bVar5) {
    do {
      if (this->start < pSVar2->length + pSVar2->left) {
        if (bVar5) {
          return;
        }
        uVar1 = pSVar2->left;
        uVar3 = this->end - uVar1;
        if (uVar1 <= this->end && uVar3 != 0) {
          pSVar4 = (SparseArraySegmentBase *)&this->start;
          if (this->start < uVar1) {
            pSVar4 = pSVar2;
          }
          this->index = ~uVar1 + pSVar4->left;
          uVar1 = pSVar2->length;
          if (uVar3 < pSVar2->length) {
            uVar1 = uVar3;
          }
          this->endIndex = uVar1;
          return;
        }
        this->seg = (SparseArraySegmentBase *)0x0;
        return;
      }
      pSVar2 = (pSVar2->next).ptr;
      this->seg = pSVar2;
      bVar5 = pSVar2 == (SparseArraySegmentBase *)0x0;
    } while (!bVar5);
  }
  return;
}

Assistant:

void JavascriptArray::ArrayElementEnumerator::Init(JavascriptArray* arr)
    {
        // Find start segment
        seg = (arr ? arr->GetBeginLookupSegment(start) : nullptr);
        while (seg && (seg->left + seg->length <= start))
        {
            seg = seg->next;
        }

        // Set start index and endIndex
        if (seg)
        {
            if (seg->left >= end)
            {
                seg = nullptr;
            }
            else
            {
                // set index to be at target index - 1, so MoveNext will move to target
                index = max(seg->left, start) - seg->left - 1;
                endIndex = min(end - seg->left, seg->length);
            }
        }
    }